

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O1

void __thiscall kratos::AssignStmt::set_parent(AssignStmt *this,IRNode *parent)

{
  IRNode *pIVar1;
  Var *pVVar2;
  shared_ptr<kratos::AssignStmt> sVar3;
  pointer local_30;
  
  pIVar1 = (this->super_Stmt).parent_;
  (this->super_Stmt).parent_ = parent;
  if (pIVar1 == (IRNode *)0x0) {
    pVVar2 = this->right_;
    sVar3 = Stmt::as<kratos::AssignStmt>((Stmt *)&stack0xffffffffffffffc8);
    (*(pVVar2->super_IRNode)._vptr_IRNode[0x15])
              (pVVar2,(Stmt *)&stack0xffffffffffffffc8,
               sVar3.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi);
    if (local_30 != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30);
    }
    if (parent != (IRNode *)0x0) {
      pVVar2 = this->left_;
      sVar3 = Stmt::as<kratos::AssignStmt>((Stmt *)&stack0xffffffffffffffc8);
      (*(pVVar2->super_IRNode)._vptr_IRNode[0x16])
                (pVVar2,(Stmt *)&stack0xffffffffffffffc8,
                 sVar3.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
      if (local_30 != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30);
      }
    }
  }
  return;
}

Assistant:

void AssignStmt::set_parent(kratos::IRNode *parent) {
    bool has_parent = parent_ != nullptr;
    Stmt::set_parent(parent);
    // push the stmt into its sources
    if (!has_parent) {
        // if it has parent, it means we've already added the source and sink
        right_->add_sink(as<AssignStmt>());
        if (parent) left_->add_source(as<AssignStmt>());
    }
}